

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::PrepareFirstFramebuffer
          (FunctionalTest *this)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  GLuint *pGVar3;
  ostringstream *this_00;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  undefined1 local_1a8 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pGVar1 = &this->m_fbo_1st;
  (**(code **)(lVar6 + 0x3c0))(1,pGVar1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c3c);
  pGVar2 = &this->m_rbo_color;
  (**(code **)(lVar6 + 0x3e0))(1,pGVar2);
  pGVar3 = &this->m_rbo_depth_stencil;
  (**(code **)(lVar6 + 0x3e0))(1,pGVar3);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c40);
  (**(code **)(lVar6 + 0xfa8))(*pGVar2,0x8229,8);
  (**(code **)(lVar6 + 0xfa8))(*pGVar3,0x88f0,8);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c44);
  (**(code **)(lVar6 + 0xf10))(*pGVar1,0x8ce0,0x8d41,*pGVar2);
  (**(code **)(lVar6 + 0xf10))(*pGVar1,0x821a,0x8d41,*pGVar3);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c48);
  iVar4 = (**(code **)(lVar6 + 0x178))(*pGVar1,0x8d40);
  if (iVar4 == 0x8cd5) {
    return true;
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"CheckNamedFramebufferStatus is incomplete.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

bool FunctionalTest::PrepareFirstFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Failure of this part shall result in test failure (it is DSA functionality failure). */
	try
	{
		gl.createFramebuffers(1, &m_fbo_1st);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

		gl.createRenderbuffers(1, &m_rbo_color);
		gl.createRenderbuffers(1, &m_rbo_depth_stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateRenderbuffers has failed");

		gl.namedRenderbufferStorage(m_rbo_color, GL_R8, 8, 8);
		gl.namedRenderbufferStorage(m_rbo_depth_stencil, GL_DEPTH24_STENCIL8, 8, 8);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedRenderbufferStorage has failed");

		gl.namedFramebufferRenderbuffer(m_fbo_1st, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_color);
		gl.namedFramebufferRenderbuffer(m_fbo_1st, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo_depth_stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedFramebufferRenderbuffer has failed");

		if (GL_FRAMEBUFFER_COMPLETE != gl.checkNamedFramebufferStatus(m_fbo_1st, GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "CheckNamedFramebufferStatus is incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}
	}
	catch (...)
	{
		return false;
	}

	return true;
}